

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

VectorSet * __thiscall
AlphaVectorPlanning::CrossSum
          (VectorSet *__return_storage_ptr__,AlphaVectorPlanning *this,VectorSet *A,VectorSet *B)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pdVar5;
  size_type sVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  size_type __n;
  ulong uVar12;
  pointer pdVar13;
  pointer pdVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar9 = A->size1_ & 0xffffffff;
  uVar2 = B->size1_;
  uVar1 = (uint)A->size2_;
  iVar8 = (int)uVar2;
  sVar6 = (size_type)(iVar8 * (int)A->size1_);
  __return_storage_ptr__->size1_ = sVar6;
  __return_storage_ptr__->size2_ = (long)(int)uVar1;
  __n = (long)(int)uVar1 * sVar6;
  (__return_storage_ptr__->data_).size_ = __n;
  if (__n == 0) {
    pdVar7 = (double *)0x0;
  }
  else {
    pdVar7 = __gnu_cxx::new_allocator<double>::allocate
                       ((new_allocator<double> *)&__return_storage_ptr__->data_,__n,(void *)0x0);
  }
  (__return_storage_ptr__->data_).data_ = pdVar7;
  if (uVar9 != 0) {
    lVar10 = 0xffffffff;
    lVar11 = 0;
    uVar12 = 0;
    do {
      if (iVar8 != 0) {
        sVar6 = B->size2_;
        pdVar13 = (B->data_).data_;
        sVar3 = __return_storage_ptr__->size2_;
        lVar10 = (long)(int)lVar10;
        sVar4 = A->size2_;
        pdVar5 = (A->data_).data_;
        pdVar14 = (pointer)((lVar10 + 1) * sVar3 * 8 + (long)(__return_storage_ptr__->data_).data_);
        uVar15 = 0;
        do {
          if ((ulong)uVar1 != 0) {
            uVar16 = 0;
            do {
              pdVar14[uVar16] =
                   *(double *)((long)pdVar5 + uVar16 * 8 + sVar4 * lVar11) + pdVar13[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar1 != uVar16);
          }
          lVar10 = lVar10 + 1;
          uVar15 = uVar15 + 1;
          pdVar13 = pdVar13 + sVar6;
          pdVar14 = pdVar14 + sVar3;
        } while (uVar15 != (uVar2 & 0xffffffff));
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar12 != uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

VectorSet AlphaVectorPlanning::CrossSum(const VectorSet &A,
                                        const VectorSet &B) const
{
    int nrInA=A.size1(),
        nrInB=B.size1(),
        nrS=A.size2();

#if DEBUG_AlphaVectorPlanning_CrossSum
    cout << "AlphaVectorPlanning::CrossSum of " << nrInA 
         << " times " << nrInB << endl;
#endif

    VectorSet C(nrInA*nrInB,nrS);
    
    int k=-1;
    for(int i=0;i!=nrInA;i++)
        for(int j=0;j!=nrInB;j++)
        {
            k++;
            for(int s=0;s!=nrS;s++)
                C(k,s)=A(i,s)+B(j,s);
        }

    return(C);
}